

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

void __thiscall Cache::printInfo(Cache *this,bool verbose)

{
  size_type sVar1;
  reference pvVar2;
  byte in_SIL;
  long in_RDI;
  char *pcVar3;
  char *pcVar4;
  Block *b;
  int j;
  uint local_10;
  
  printf("---------- Cache Info -----------\n");
  printf("Cache Size: %d bytes\n",(ulong)*(uint *)(in_RDI + 0x30));
  printf("Block Size: %d bytes\n",(ulong)*(uint *)(in_RDI + 0x34));
  printf("Block Num: %d\n",(ulong)*(uint *)(in_RDI + 0x38));
  printf("Associativiy: %d\n",(ulong)*(uint *)(in_RDI + 0x3c));
  printf("Hit Latency: %d\n",(ulong)*(uint *)(in_RDI + 0x40));
  printf("Miss Latency: %d\n",(ulong)*(uint *)(in_RDI + 0x44));
  if ((in_SIL & 1) != 0) {
    for (local_10 = 0;
        sVar1 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::size
                          ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x48)),
        (ulong)(long)(int)local_10 < sVar1; local_10 = local_10 + 1) {
      pvVar2 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                         ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x48),
                          (long)(int)local_10);
      pcVar3 = "invalid";
      if ((pvVar2->valid & 1U) != 0) {
        pcVar3 = "valid";
      }
      pcVar4 = "unmodified";
      if ((pvVar2->modified & 1U) != 0) {
        pcVar4 = "modified";
      }
      printf("Block %d: tag 0x%x id %d %s %s (last ref %d)\n",(ulong)local_10,(ulong)pvVar2->tag,
             (ulong)pvVar2->id,pcVar3,pcVar4,pvVar2->lastReference);
    }
  }
  return;
}

Assistant:

void Cache::printInfo(bool verbose) {
  printf("---------- Cache Info -----------\n");
  printf("Cache Size: %d bytes\n", this->policy.cacheSize);
  printf("Block Size: %d bytes\n", this->policy.blockSize);
  printf("Block Num: %d\n", this->policy.blockNum);
  printf("Associativiy: %d\n", this->policy.associativity);
  printf("Hit Latency: %d\n", this->policy.hitLatency);
  printf("Miss Latency: %d\n", this->policy.missLatency);

  if (verbose) {
    for (int j = 0; j < this->blocks.size(); ++j) {
      const Block &b = this->blocks[j];
      printf("Block %d: tag 0x%x id %d %s %s (last ref %d)\n", j, b.tag, b.id,
             b.valid ? "valid" : "invalid",
             b.modified ? "modified" : "unmodified", b.lastReference);
      // printf("Data: ");
      // for (uint8_t d : b.data)
      // printf("%d ", d);
      // printf("\n");
    }
  }
}